

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

timediff_t ftp_timeleft_accept(Curl_easy *data)

{
  undefined8 uVar1;
  undefined4 uVar2;
  long lVar3;
  timediff_t tVar4;
  curltime cVar5;
  curltime older;
  undefined1 local_38 [8];
  curltime now;
  timediff_t other;
  timediff_t timeout_ms;
  Curl_easy *data_local;
  
  other = 60000;
  if (0 < (data->set).accepttimeout) {
    other = (data->set).accepttimeout;
  }
  cVar5 = Curl_now();
  local_38 = (undefined1  [8])cVar5.tv_sec;
  now.tv_sec._0_4_ = cVar5.tv_usec;
  now._8_8_ = Curl_timeleft(data,(curltime *)local_38,false);
  if ((now._8_8_ == 0) || (lVar3 = now._8_8_, other <= (long)now._8_8_)) {
    cVar5.tv_usec = (int)now.tv_sec;
    cVar5.tv_sec = (time_t)local_38;
    uVar1 = (data->progress).t_acceptdata.tv_sec;
    uVar2 = (data->progress).t_acceptdata.tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    cVar5._12_4_ = 0;
    older._12_4_ = 0;
    tVar4 = Curl_timediff(cVar5,older);
    lVar3 = other - tVar4;
    if (other - tVar4 == 0) {
      return -1;
    }
  }
  other = lVar3;
  return other;
}

Assistant:

static timediff_t ftp_timeleft_accept(struct Curl_easy *data)
{
  timediff_t timeout_ms = DEFAULT_ACCEPT_TIMEOUT;
  timediff_t other;
  struct curltime now;

  if(data->set.accepttimeout > 0)
    timeout_ms = data->set.accepttimeout;

  now = Curl_now();

  /* check if the generic timeout possibly is set shorter */
  other = Curl_timeleft(data, &now, FALSE);
  if(other && (other < timeout_ms))
    /* note that this also works fine for when other happens to be negative
       due to it already having elapsed */
    timeout_ms = other;
  else {
    /* subtract elapsed time */
    timeout_ms -= Curl_timediff(now, data->progress.t_acceptdata);
    if(!timeout_ms)
      /* avoid returning 0 as that means no timeout! */
      return -1;
  }

  return timeout_ms;
}